

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::UninterpretedOption::UninterpretedOption(UninterpretedOption *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__UninterpretedOption_002985b0;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  (this->name_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->name_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->name_).super_RepeatedPtrFieldBase.total_size_ = 0;
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  this->identifier_value_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->double_value_ = 0.0;
  this->positive_int_value_ = 0;
  this->negative_int_value_ = 0;
  this->string_value_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->aggregate_value_ = (string *)internal::kEmptyString_abi_cxx11_;
  return;
}

Assistant:

UninterpretedOption::UninterpretedOption()
  : ::google::protobuf::Message() {
  SharedCtor();
}